

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::clear_no_deallocate(MidiFile *this)

{
  int iVar1;
  reference ppMVar2;
  MidiEventList *pMVar3;
  int local_14;
  int i;
  MidiFile *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = getTrackCount(this);
    if (iVar1 <= local_14) break;
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)local_14);
    MidiEventList::detach(*ppMVar2);
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)local_14);
    pMVar3 = *ppMVar2;
    if (pMVar3 != (MidiEventList *)0x0) {
      MidiEventList::~MidiEventList(pMVar3);
      operator_delete(pMVar3);
    }
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)local_14);
    *ppMVar2 = (value_type)0x0;
    local_14 = local_14 + 1;
  }
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,1);
  pMVar3 = (MidiEventList *)operator_new(0x18);
  MidiEventList::MidiEventList(pMVar3);
  ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                      (&this->m_events,0);
  *ppMVar2 = pMVar3;
  this->m_timemapvalid = false;
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::clear(&this->m_timemap);
  return;
}

Assistant:

void MidiFile::clear_no_deallocate(void) {
	for (int i=0; i<getTrackCount(); i++) {
		m_events[i]->detach();
		delete m_events[i];
		m_events[i] = NULL;
	}
	m_events.resize(1);
	m_events[0] = new MidiEventList;
	m_timemapvalid=0;
	m_timemap.clear();
	// m_events.resize(0);   // causes a memory leak [20150205 Jorden Thatcher]
}